

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O0

void __thiscall
rw::ColorQuant::matchImage(ColorQuant *this,uint8 *dstPixels,uint32 dstStride,Image *img)

{
  uint8 uVar1;
  uint8 *d;
  uint8 *p;
  uint8 *puStack_50;
  int x;
  uint8 *dline;
  uint8 *line;
  uint8 *puStack_38;
  int y;
  uint8 *pixels;
  uint8 rgba [4];
  RGBA col;
  Image *img_local;
  uint8 *puStack_18;
  uint32 dstStride_local;
  uint8 *dstPixels_local;
  ColorQuant *this_local;
  
  puStack_38 = img->pixels;
  _rgba = img;
  puStack_18 = dstPixels;
  for (line._4_4_ = 0; line._4_4_ < _rgba->height; line._4_4_ = line._4_4_ + 1) {
    dline = puStack_38;
    puStack_50 = puStack_18;
    for (p._4_4_ = 0; p._4_4_ < _rgba->width; p._4_4_ = p._4_4_ + 1) {
      switch(_rgba->depth) {
      case 4:
      case 8:
        conv_RGBA8888_from_RGBA8888((uint8 *)&pixels,_rgba->palette + (int)((uint)*dline << 2));
        break;
      default:
        break;
      case 0x10:
        conv_RGBA8888_from_ARGB1555((uint8 *)&pixels,dline);
        break;
      case 0x18:
        conv_RGBA8888_from_RGB888((uint8 *)&pixels,dline);
        break;
      case 0x20:
        conv_RGBA8888_from_RGBA8888((uint8 *)&pixels,dline);
      }
      pixels._4_4_ = (RGBA)CONCAT13(pixels._3_1_,
                                    CONCAT12(pixels._2_1_,CONCAT11(pixels._1_1_,pixels._0_1_)));
      uVar1 = findColor(this,pixels._4_4_);
      *puStack_50 = uVar1;
      dline = dline + _rgba->bpp;
      puStack_50 = puStack_50 + 1;
    }
    puStack_38 = puStack_38 + _rgba->stride;
    puStack_18 = puStack_18 + dstStride;
  }
  return;
}

Assistant:

void
ColorQuant::matchImage(uint8 *dstPixels, uint32 dstStride, Image *img)
{
	RGBA col;
	uint8 rgba[4];
	uint8 *pixels = img->pixels;
	for(int y = 0; y < img->height; y++){
		uint8 *line = pixels;
		uint8 *dline = dstPixels;
		for(int x = 0; x < img->width; x++){
			uint8 *p = line;
			uint8 *d = dline;
			switch(img->depth){
			case 4: case 8:
				conv_RGBA8888_from_RGBA8888(rgba, &img->palette[p[0]*4]);
				break;
			case 32:
				conv_RGBA8888_from_RGBA8888(rgba, p);
				break;
			case 24:
				conv_RGBA8888_from_RGB888(rgba, p);
				break;
			case 16:
				conv_RGBA8888_from_ARGB1555(rgba, p);
				break;
			default: assert(0 && "invalid depth");
			}
			
			col.red = rgba[0];
			col.green = rgba[1];
			col.blue = rgba[2];
			col.alpha = rgba[3];
			*d = this->findColor(col);

			line += img->bpp;
			dline++;
		}
		pixels += img->stride;
		dstPixels += dstStride;
	}
}